

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O1

ParserMetadata *
slang::parsing::ParserMetadata::fromSyntax(ParserMetadata *__return_storage_ptr__,SyntaxNode *root)

{
  MetadataVisitor *ctx;
  MetadataVisitor visitor;
  MetadataVisitor local_1e0;
  
  ParserMetadata(&local_1e0.meta);
  local_1e0.moduleDeclStack.
  super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .data_ = (pointer)local_1e0.moduleDeclStack.
                    super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    .firstElement;
  local_1e0.moduleDeclStack.
  super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .len = 0;
  local_1e0.moduleDeclStack.
  super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .cap = 4;
  local_1e0.defaultNetType = Unknown;
  local_1e0.unconnectedDrive = Unknown;
  local_1e0.cellDefine = false;
  local_1e0.timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  slang::syntax::detail::
  visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
            (root,&local_1e0);
  ctx = &local_1e0;
  ParserMetadata(__return_storage_ptr__,&ctx->meta);
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::cleanup(&local_1e0.moduleDeclStack.
             super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ,(EVP_PKEY_CTX *)ctx);
  if (local_1e0.meta.interfacePorts.
      super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.meta.interfacePorts.
                    super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.meta.interfacePorts.
                          super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.meta.interfacePorts.
                          super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e0.meta.classDecls.
      super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.meta.classDecls.
                    super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.meta.classDecls.
                          super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.meta.classDecls.
                          super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e0.meta.packageImports.
      super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.meta.packageImports.
                    super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.meta.packageImports.
                          super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.meta.packageImports.
                          super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e0.meta.classPackageNames.
      super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.meta.classPackageNames.
                    super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.meta.classPackageNames.
                          super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.meta.classPackageNames.
                          super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e0.meta.globalInstances.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .arrays.elements_ != (value_type_pointer)0x0) {
    operator_delete(local_1e0.meta.globalInstances.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .arrays.elements_,
                    local_1e0.meta.globalInstances.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .arrays.groups_size_mask * 0x100 + 0x100);
  }
  if (local_1e0.meta.nodeMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
      .arrays.elements_ != (value_type_pointer)0x0) {
    operator_delete(local_1e0.meta.nodeMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                    .arrays.elements_,
                    ((local_1e0.meta.nodeMap.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                      .arrays.groups_size_mask * 0x178 + 0x186) / 3 & 0xfffffffffffffff8) * 3);
  }
  return __return_storage_ptr__;
}

Assistant:

ParserMetadata ParserMetadata::fromSyntax(const SyntaxNode& root) {
    MetadataVisitor visitor;
    root.visit(visitor);
    return visitor.meta;
}